

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

config_value * config_value_create_boolean(_Bool boolean)

{
  config_value *value;
  config_value *pcStack_10;
  _Bool boolean_local;
  
  pcStack_10 = (config_value *)malloc(0x10);
  if (pcStack_10 == (config_value *)0x0) {
    pcStack_10 = (config_value *)0x0;
  }
  else {
    pcStack_10->type = BOOLEAN;
    (pcStack_10->data).boolean = boolean;
  }
  return pcStack_10;
}

Assistant:

struct config_value *config_value_create_boolean(bool boolean)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = BOOLEAN;
        value->data.boolean = boolean;

        return value;
}